

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper_sse2.cpp
# Opt level: O0

void comp_func_SourceOver_sse2(uint *destPixels,uint *srcPixels,int length,uint const_alpha)

{
  ulong uVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  unsigned_long_long *puVar10;
  ulong *puVar11;
  undefined8 *puVar12;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  ulong in_RDI;
  long in_FS_OFFSET;
  uint uVar13;
  ushort uVar14;
  ushort uVar15;
  ushort uVar18;
  ushort uVar20;
  ulong uVar16;
  ushort uVar19;
  ushort uVar21;
  ushort uVar22;
  ulong uVar17;
  ushort uVar23;
  ushort uVar24;
  ushort uVar27;
  ushort uVar28;
  ulong uVar25;
  ushort uVar29;
  ushort uVar30;
  ulong uVar26;
  int _i_1;
  __m128i result_1;
  __m128i pixelVectorRB_2;
  __m128i pixelVectorAG_2;
  __m128i destMultipliedByOneMinusAlpha_1;
  __m128i dstVector_1;
  __m128i alphaChannel_1;
  __m128i pixelVectorRB_1;
  __m128i pixelVectorAG_1;
  __m128i srcVector_1;
  int x_1;
  __m128i constAlphaVector;
  int _i;
  __m128i result;
  __m128i pixelVectorRB;
  __m128i pixelVectorAG;
  __m128i destMultipliedByOneMinusAlpha;
  __m128i dstVector;
  __m128i alphaChannel;
  __m128i srcVectorAlpha;
  __m128i srcVector;
  int x;
  __m128i alphaMask;
  __m128i colorMask;
  __m128i one;
  __m128i half;
  __m128i nullVector;
  quint32 *dst;
  quint32 *src;
  quint32 in_stack_fffffffffffff5bc;
  undefined7 in_stack_fffffffffffff5c0;
  undefined1 in_stack_fffffffffffff5c7;
  undefined1 *in_stack_fffffffffffff5c8;
  quint32 *in_stack_fffffffffffff5d0;
  int local_a0c;
  undefined8 local_a08;
  undefined8 uStack_a00;
  undefined8 local_9e8;
  undefined8 uStack_9e0;
  undefined8 local_998;
  undefined8 uStack_990;
  int local_96c;
  int local_94c;
  undefined8 local_948;
  undefined8 uStack_940;
  undefined8 local_928;
  undefined8 uStack_920;
  int local_8bc;
  short local_858;
  int local_758;
  int iStack_754;
  int iStack_750;
  int iStack_74c;
  int local_718;
  int iStack_714;
  int iStack_710;
  int iStack_70c;
  ushort local_598;
  ushort uStack_596;
  ushort uStack_594;
  ushort uStack_590;
  ushort uStack_58c;
  ushort local_578;
  ushort uStack_576;
  ushort uStack_574;
  ushort uStack_570;
  ushort uStack_56c;
  ushort local_4d8;
  ushort uStack_4d6;
  ushort uStack_4d4;
  ushort uStack_4d2;
  ushort uStack_4d0;
  ushort uStack_4ce;
  ushort uStack_4cc;
  ushort uStack_4ca;
  ushort local_458;
  ushort uStack_456;
  ushort uStack_454;
  ushort uStack_452;
  ushort uStack_450;
  ushort uStack_44e;
  ushort uStack_44c;
  ushort uStack_44a;
  ushort local_3d8;
  ushort uStack_3d6;
  ushort uStack_3d4;
  ushort uStack_3d2;
  ushort uStack_3d0;
  ushort uStack_3ce;
  ushort uStack_3cc;
  ushort uStack_3ca;
  short local_3b8;
  short sStack_3b6;
  short sStack_3b4;
  short sStack_3b2;
  short sStack_3b0;
  short sStack_3ae;
  short sStack_3ac;
  short sStack_3aa;
  short local_378;
  short sStack_376;
  short sStack_374;
  short sStack_372;
  short sStack_370;
  short sStack_36e;
  short sStack_36c;
  short sStack_36a;
  short local_338;
  short sStack_336;
  short sStack_334;
  short sStack_332;
  short sStack_330;
  short sStack_32e;
  short sStack_32c;
  short sStack_32a;
  char local_128;
  char cStack_127;
  char cStack_126;
  char cStack_125;
  char cStack_124;
  char cStack_123;
  char cStack_122;
  char cStack_121;
  char cStack_120;
  char cStack_11f;
  char cStack_11e;
  char cStack_11d;
  char cStack_11c;
  char cStack_11b;
  char cStack_11a;
  char cStack_119;
  char local_118;
  char cStack_117;
  char cStack_116;
  char cStack_114;
  char cStack_113;
  char cStack_112;
  char cStack_110;
  char cStack_10f;
  char cStack_10e;
  char cStack_10c;
  char cStack_10b;
  char cStack_10a;
  char local_108;
  char cStack_107;
  char cStack_106;
  char cStack_105;
  char cStack_104;
  char cStack_103;
  char cStack_102;
  char cStack_101;
  char cStack_100;
  char cStack_ff;
  char cStack_fe;
  char cStack_fd;
  char cStack_fc;
  char cStack_fb;
  char cStack_fa;
  char cStack_f9;
  char local_f8;
  char cStack_f7;
  char cStack_f6;
  char cStack_f4;
  char cStack_f3;
  char cStack_f2;
  char cStack_f0;
  char cStack_ef;
  char cStack_ee;
  char cStack_ec;
  char cStack_eb;
  char cStack_ea;
  ulong local_28;
  unsigned_long_long local_20;
  ulong local_18;
  unsigned_long_long local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ECX == 0xff) {
    local_8bc = 0;
    while( true ) {
      local_10 = (unsigned_long_long)in_EDX;
      local_18 = 4 - (in_RDI >> 2 & 3) & 3;
      puVar10 = qMin<unsigned_long_long>(&local_10,&local_18);
      if ((int)*puVar10 <= local_8bc) break;
      blend_pixel((quint32 *)CONCAT17(in_stack_fffffffffffff5c7,in_stack_fffffffffffff5c0),
                  in_stack_fffffffffffff5bc);
      local_8bc = local_8bc + 1;
    }
    for (; local_8bc < in_EDX + -3; local_8bc = local_8bc + 4) {
      puVar11 = (ulong *)(in_RSI + (long)local_8bc * 4);
      uVar1 = *puVar11;
      uVar2 = puVar11[1];
      local_718 = (int)(uVar1 & 0xff000000ff000000);
      iStack_714 = (int)((uVar1 & 0xff000000ff000000) >> 0x20);
      iStack_710 = (int)(uVar2 & 0xff000000ff000000);
      iStack_70c = (int)((uVar2 & 0xff000000ff000000) >> 0x20);
      uVar13 = -(uint)(iStack_70c == -0x1000000);
      auVar5._4_4_ = -(uint)(iStack_714 == -0x1000000);
      auVar5._0_4_ = -(uint)(local_718 == -0x1000000);
      auVar5._8_4_ = -(uint)(iStack_710 == -0x1000000);
      auVar5._12_4_ = uVar13;
      if ((ushort)((ushort)(SUB161(auVar5 >> 7,0) & 1) | (ushort)(SUB161(auVar5 >> 0xf,0) & 1) << 1
                   | (ushort)(SUB161(auVar5 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar5 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar5 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar5 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar5 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar5 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar5 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar5 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar5 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar5 >> 0x5f,0) & 1) << 0xb |
                   (ushort)((byte)(uVar13 >> 7) & 1) << 0xc |
                   (ushort)((byte)(uVar13 >> 0xf) & 1) << 0xd |
                   (ushort)((byte)(uVar13 >> 0x17) & 1) << 0xe |
                  (ushort)(byte)(uVar13 >> 0x1f) << 0xf) == 0xffff) {
        puVar11 = (ulong *)(in_RDI + (long)local_8bc * 4);
        *puVar11 = uVar1;
        puVar11[1] = uVar2;
      }
      else {
        uVar13 = -(uint)(iStack_70c == 0);
        auVar4._4_4_ = -(uint)(iStack_714 == 0);
        auVar4._0_4_ = -(uint)(local_718 == 0);
        auVar4._8_4_ = -(uint)(iStack_710 == 0);
        auVar4._12_4_ = uVar13;
        if ((ushort)((ushort)(SUB161(auVar4 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar4 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar4 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar4 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar4 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar4 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar4 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar4 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar4 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar4 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar4 >> 0x5f,0) & 1) << 0xb |
                     (ushort)((byte)(uVar13 >> 7) & 1) << 0xc |
                     (ushort)((byte)(uVar13 >> 0xf) & 1) << 0xd |
                     (ushort)((byte)(uVar13 >> 0x17) & 1) << 0xe |
                    (ushort)(byte)(uVar13 >> 0x1f) << 0xf) != 0xffff) {
          bVar9 = (byte)(uVar1 >> 0x38);
          uStack_574 = (ushort)bVar9;
          bVar8 = (byte)(uVar1 >> 0x18);
          local_578 = (ushort)bVar8;
          uStack_576 = (ushort)bVar8;
          bVar6 = (byte)(uVar2 >> 0x18);
          uStack_570 = (ushort)bVar6;
          bVar7 = (byte)(uVar2 >> 0x38);
          uStack_56c = (ushort)bVar7;
          puVar11 = (ulong *)(in_RDI + (long)local_8bc * 4);
          uVar17 = *puVar11;
          uVar26 = puVar11[1];
          local_3d8 = (ushort)uVar17;
          uStack_3d6 = (ushort)(uVar17 >> 0x10);
          uStack_3d4 = (ushort)(uVar17 >> 0x20);
          uStack_3d0 = (ushort)uVar26;
          uStack_3ce = (ushort)(uVar26 >> 0x10);
          uStack_3cc = (ushort)(uVar26 >> 0x20);
          uVar16 = uVar17 & 0xff00ff00ff00ff;
          uVar25 = uVar26 & 0xff00ff00ff00ff;
          uVar14 = (local_3d8 >> 8) * (0xff - local_578);
          uVar18 = (uStack_3d6 >> 8) * (0xff - uStack_576);
          uVar20 = (uStack_3d4 >> 8) * (0xff - uStack_574);
          uVar22 = (ushort)(uVar17 >> 0x38) * 0xff;
          uVar23 = (uStack_3d0 >> 8) * (0xff - uStack_570);
          uVar27 = (uStack_3ce >> 8) * 0xff;
          uVar28 = (uStack_3cc >> 8) * (0xff - uStack_56c);
          uVar30 = (ushort)(uVar26 >> 0x38) * 0xff;
          local_338 = (short)uVar16;
          sStack_336 = (short)(uVar16 >> 0x10);
          sStack_334 = (short)(uVar16 >> 0x20);
          sStack_332 = (short)(uVar16 >> 0x30);
          sStack_330 = (short)uVar25;
          sStack_32e = (short)(uVar25 >> 0x10);
          sStack_32c = (short)(uVar25 >> 0x20);
          sStack_32a = (short)(uVar25 >> 0x30);
          uVar15 = local_338 * (0xff - local_578);
          uVar19 = sStack_336 * (0xff - uStack_576);
          uVar21 = sStack_334 * (0xff - uStack_574);
          uVar24 = sStack_330 * (0xff - uStack_570);
          uVar29 = sStack_32c * (0xff - uStack_56c);
          local_928 = CONCAT26(uVar22 + (uVar22 >> 8) + 0x80,
                               CONCAT24(uVar20 + (uVar20 >> 8) + 0x80,
                                        CONCAT22(uVar18 + (uVar18 >> 8) + 0x80,
                                                 uVar14 + (uVar14 >> 8) + 0x80)));
          uStack_920 = CONCAT26(uVar30 + (uVar30 >> 8) + 0x80,
                                CONCAT24(uVar28 + (uVar28 >> 8) + 0x80,
                                         CONCAT22(uVar27 + (uVar27 >> 8) + 0x80,
                                                  uVar23 + (uVar23 >> 8) + 0x80)));
          local_928 = local_928 & 0xff00ff00ff00ff00;
          uStack_920 = uStack_920 & 0xff00ff00ff00ff00;
          local_f8 = (char)uVar1;
          cStack_f7 = (char)(uVar1 >> 8);
          cStack_f6 = (char)(uVar1 >> 0x10);
          cStack_f4 = (char)(uVar1 >> 0x20);
          cStack_f3 = (char)(uVar1 >> 0x28);
          cStack_f2 = (char)(uVar1 >> 0x30);
          cStack_f0 = (char)uVar2;
          cStack_ef = (char)(uVar2 >> 8);
          cStack_ee = (char)(uVar2 >> 0x10);
          cStack_ec = (char)(uVar2 >> 0x20);
          cStack_eb = (char)(uVar2 >> 0x28);
          cStack_ea = (char)(uVar2 >> 0x30);
          local_108 = (char)((ushort)(uVar15 + (uVar15 >> 8) + 0x80) >> 8);
          cStack_107 = (char)(local_928 >> 8);
          cStack_106 = (char)((ushort)(uVar19 + (uVar19 >> 8) + 0x80) >> 8);
          cStack_105 = (char)(local_928 >> 0x18);
          cStack_104 = (char)((ushort)(uVar21 + (uVar21 >> 8) + 0x80) >> 8);
          cStack_103 = (char)(local_928 >> 0x28);
          cStack_102 = (char)((ushort)(sStack_332 * 0xff + ((ushort)(sStack_332 * 0xff) >> 8) + 0x80
                                      ) >> 8);
          cStack_101 = (char)(local_928 >> 0x38);
          cStack_100 = (char)((ushort)(uVar24 + (uVar24 >> 8) + 0x80) >> 8);
          cStack_ff = (char)(uStack_920 >> 8);
          cStack_fe = (char)((ushort)(sStack_32e * 0xff + ((ushort)(sStack_32e * 0xff) >> 8) + 0x80)
                            >> 8);
          cStack_fd = (char)(uStack_920 >> 0x18);
          cStack_fc = (char)((ushort)(uVar29 + (uVar29 >> 8) + 0x80) >> 8);
          cStack_fb = (char)(uStack_920 >> 0x28);
          cStack_fa = (char)((ushort)(sStack_32a * 0xff + ((ushort)(sStack_32a * 0xff) >> 8) + 0x80)
                            >> 8);
          cStack_f9 = (char)(uStack_920 >> 0x38);
          local_948 = CONCAT17(bVar9 + cStack_101,
                               CONCAT16(cStack_f2 + cStack_102,
                                        CONCAT15(cStack_f3 + cStack_103,
                                                 CONCAT14(cStack_f4 + cStack_104,
                                                          CONCAT13(bVar8 + cStack_105,
                                                                   CONCAT12(cStack_f6 + cStack_106,
                                                                            CONCAT11(cStack_f7 +
                                                                                     cStack_107,
                                                                                     local_f8 +
                                                                                     local_108))))))
                              );
          uStack_940 = CONCAT17(bVar7 + cStack_f9,
                                CONCAT16(cStack_ea + cStack_fa,
                                         CONCAT15(cStack_eb + cStack_fb,
                                                  CONCAT14(cStack_ec + cStack_fc,
                                                           CONCAT13(bVar6 + cStack_fd,
                                                                    CONCAT12(cStack_ee + cStack_fe,
                                                                             CONCAT11(cStack_ef +
                                                                                      cStack_ff,
                                                                                      cStack_f0 +
                                                                                      cStack_100))))
                                                 )));
          puVar12 = (undefined8 *)(in_RDI + (long)local_8bc * 4);
          *puVar12 = local_948;
          puVar12[1] = uStack_940;
        }
      }
    }
    for (local_94c = 0; local_94c < 3 && local_8bc < in_EDX; local_94c = local_94c + 1) {
      blend_pixel((quint32 *)CONCAT17(in_stack_fffffffffffff5c7,in_stack_fffffffffffff5c0),
                  in_stack_fffffffffffff5bc);
      local_8bc = local_8bc + 1;
    }
  }
  else {
    local_858 = (short)in_ECX;
    local_96c = 0;
    while( true ) {
      local_20 = (unsigned_long_long)in_EDX;
      local_28 = 4 - (in_RDI >> 2 & 3) & 3;
      puVar10 = qMin<unsigned_long_long>(&local_20,&local_28);
      if ((int)*puVar10 <= local_96c) break;
      blend_pixel(in_stack_fffffffffffff5d0,(quint32)((ulong)in_stack_fffffffffffff5c8 >> 0x20),
                  (int)in_stack_fffffffffffff5c8);
      local_96c = local_96c + 1;
    }
    for (; local_96c < in_EDX + -3; local_96c = local_96c + 4) {
      puVar11 = (ulong *)(in_RSI + (long)local_96c * 4);
      uVar1 = *puVar11;
      uVar2 = puVar11[1];
      local_758 = (int)uVar1;
      iStack_754 = (int)(uVar1 >> 0x20);
      iStack_750 = (int)uVar2;
      iStack_74c = (int)(uVar2 >> 0x20);
      uVar13 = -(uint)(iStack_74c == 0);
      auVar3._4_4_ = -(uint)(iStack_754 == 0);
      auVar3._0_4_ = -(uint)(local_758 == 0);
      auVar3._8_4_ = -(uint)(iStack_750 == 0);
      auVar3._12_4_ = uVar13;
      if ((ushort)((ushort)(SUB161(auVar3 >> 7,0) & 1) | (ushort)(SUB161(auVar3 >> 0xf,0) & 1) << 1
                   | (ushort)(SUB161(auVar3 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar3 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar3 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar3 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar3 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar3 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar3 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar3 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar3 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar3 >> 0x5f,0) & 1) << 0xb |
                   (ushort)((byte)(uVar13 >> 7) & 1) << 0xc |
                   (ushort)((byte)(uVar13 >> 0xf) & 1) << 0xd |
                   (ushort)((byte)(uVar13 >> 0x17) & 1) << 0xe |
                  (ushort)(byte)(uVar13 >> 0x1f) << 0xf) != 0xffff) {
        in_stack_fffffffffffff5c8 = &DAT_aaaaaaaaaaaaaaaa;
        in_stack_fffffffffffff5d0 = (quint32 *)&DAT_aaaaaaaaaaaaaaaa;
        local_458 = (ushort)uVar1;
        uStack_456 = (ushort)(uVar1 >> 0x10);
        uStack_454 = (ushort)(uVar1 >> 0x20);
        uStack_450 = (ushort)uVar2;
        uStack_44e = (ushort)(uVar2 >> 0x10);
        uStack_44c = (ushort)(uVar2 >> 0x20);
        uVar17 = uVar1 & 0xff00ff00ff00ff;
        uVar26 = uVar2 & 0xff00ff00ff00ff;
        uVar14 = (local_458 >> 8) * local_858;
        uVar15 = (uStack_456 >> 8) * local_858;
        uVar18 = (uStack_454 >> 8) * local_858;
        uVar19 = (ushort)(uVar1 >> 0x38) * local_858;
        uVar20 = (uStack_450 >> 8) * local_858;
        uVar21 = (uStack_44e >> 8) * local_858;
        uVar22 = (uStack_44c >> 8) * local_858;
        uVar23 = (ushort)(uVar2 >> 0x38) * local_858;
        local_378 = (short)uVar17;
        sStack_376 = (short)(uVar17 >> 0x10);
        sStack_374 = (short)(uVar17 >> 0x20);
        sStack_372 = (short)(uVar17 >> 0x30);
        sStack_370 = (short)uVar26;
        sStack_36e = (short)(uVar26 >> 0x10);
        sStack_36c = (short)(uVar26 >> 0x20);
        sStack_36a = (short)(uVar26 >> 0x30);
        local_998 = CONCAT26(uVar19 + (uVar19 >> 8) + 0x80,
                             CONCAT24(uVar18 + (uVar18 >> 8) + 0x80,
                                      CONCAT22(uVar15 + (uVar15 >> 8) + 0x80,
                                               uVar14 + (uVar14 >> 8) + 0x80)));
        uStack_990 = CONCAT26(uVar23 + (uVar23 >> 8) + 0x80,
                              CONCAT24(uVar22 + (uVar22 >> 8) + 0x80,
                                       CONCAT22(uVar21 + (uVar21 >> 8) + 0x80,
                                                uVar20 + (uVar20 >> 8) + 0x80)));
        local_998 = local_998 & 0xff00ff00ff00ff00;
        uStack_990 = uStack_990 & 0xff00ff00ff00ff00;
        bVar9 = (byte)(local_998 >> 0x38);
        uStack_594 = (ushort)bVar9;
        bVar8 = (byte)(local_998 >> 0x18);
        local_598 = (ushort)bVar8;
        uStack_596 = (ushort)bVar8;
        bVar6 = (byte)(uStack_990 >> 0x18);
        uStack_590 = (ushort)bVar6;
        bVar7 = (byte)(uStack_990 >> 0x38);
        uStack_58c = (ushort)bVar7;
        puVar11 = (ulong *)(in_RDI + (long)local_96c * 4);
        uVar1 = *puVar11;
        uVar2 = puVar11[1];
        local_4d8 = (ushort)uVar1;
        uStack_4d6 = (ushort)(uVar1 >> 0x10);
        uStack_4d4 = (ushort)(uVar1 >> 0x20);
        uStack_4d0 = (ushort)uVar2;
        uStack_4ce = (ushort)(uVar2 >> 0x10);
        uStack_4cc = (ushort)(uVar2 >> 0x20);
        uVar17 = uVar1 & 0xff00ff00ff00ff;
        uVar26 = uVar2 & 0xff00ff00ff00ff;
        uVar14 = (local_4d8 >> 8) * (0xff - local_598);
        uVar18 = (uStack_4d6 >> 8) * (0xff - uStack_596);
        uVar20 = (uStack_4d4 >> 8) * (0xff - uStack_594);
        uVar22 = (ushort)(uVar1 >> 0x38) * 0xff;
        uVar23 = (uStack_4d0 >> 8) * (0xff - uStack_590);
        uVar27 = (uStack_4ce >> 8) * 0xff;
        uVar28 = (uStack_4cc >> 8) * (0xff - uStack_58c);
        uVar30 = (ushort)(uVar2 >> 0x38) * 0xff;
        local_3b8 = (short)uVar17;
        sStack_3b6 = (short)(uVar17 >> 0x10);
        sStack_3b4 = (short)(uVar17 >> 0x20);
        sStack_3b2 = (short)(uVar17 >> 0x30);
        sStack_3b0 = (short)uVar26;
        sStack_3ae = (short)(uVar26 >> 0x10);
        sStack_3ac = (short)(uVar26 >> 0x20);
        sStack_3aa = (short)(uVar26 >> 0x30);
        uVar15 = local_3b8 * (0xff - local_598);
        uVar19 = sStack_3b6 * (0xff - uStack_596);
        uVar21 = sStack_3b4 * (0xff - uStack_594);
        uVar24 = sStack_3b0 * (0xff - uStack_590);
        uVar29 = sStack_3ac * (0xff - uStack_58c);
        local_9e8 = CONCAT26(uVar22 + (uVar22 >> 8) + 0x80,
                             CONCAT24(uVar20 + (uVar20 >> 8) + 0x80,
                                      CONCAT22(uVar18 + (uVar18 >> 8) + 0x80,
                                               uVar14 + (uVar14 >> 8) + 0x80)));
        uStack_9e0 = CONCAT26(uVar30 + (uVar30 >> 8) + 0x80,
                              CONCAT24(uVar28 + (uVar28 >> 8) + 0x80,
                                       CONCAT22(uVar27 + (uVar27 >> 8) + 0x80,
                                                uVar23 + (uVar23 >> 8) + 0x80)));
        local_9e8 = local_9e8 & 0xff00ff00ff00ff00;
        uStack_9e0 = uStack_9e0 & 0xff00ff00ff00ff00;
        local_118 = (char)((ushort)(local_378 * local_858 + ((ushort)(local_378 * local_858) >> 8) +
                                   0x80) >> 8);
        cStack_117 = (char)(local_998 >> 8);
        cStack_116 = (char)((ushort)(sStack_376 * local_858 +
                                     ((ushort)(sStack_376 * local_858) >> 8) + 0x80) >> 8);
        cStack_114 = (char)((ushort)(sStack_374 * local_858 +
                                     ((ushort)(sStack_374 * local_858) >> 8) + 0x80) >> 8);
        cStack_113 = (char)(local_998 >> 0x28);
        cStack_112 = (char)((ushort)(sStack_372 * local_858 +
                                     ((ushort)(sStack_372 * local_858) >> 8) + 0x80) >> 8);
        cStack_110 = (char)((ushort)(sStack_370 * local_858 +
                                     ((ushort)(sStack_370 * local_858) >> 8) + 0x80) >> 8);
        cStack_10f = (char)(uStack_990 >> 8);
        cStack_10e = (char)((ushort)(sStack_36e * local_858 +
                                     ((ushort)(sStack_36e * local_858) >> 8) + 0x80) >> 8);
        cStack_10c = (char)((ushort)(sStack_36c * local_858 +
                                     ((ushort)(sStack_36c * local_858) >> 8) + 0x80) >> 8);
        cStack_10b = (char)(uStack_990 >> 0x28);
        cStack_10a = (char)((ushort)(sStack_36a * local_858 +
                                     ((ushort)(sStack_36a * local_858) >> 8) + 0x80) >> 8);
        local_128 = (char)((ushort)(uVar15 + (uVar15 >> 8) + 0x80) >> 8);
        cStack_127 = (char)(local_9e8 >> 8);
        cStack_126 = (char)((ushort)(uVar19 + (uVar19 >> 8) + 0x80) >> 8);
        cStack_125 = (char)(local_9e8 >> 0x18);
        cStack_124 = (char)((ushort)(uVar21 + (uVar21 >> 8) + 0x80) >> 8);
        cStack_123 = (char)(local_9e8 >> 0x28);
        cStack_122 = (char)((ushort)(sStack_3b2 * 0xff + ((ushort)(sStack_3b2 * 0xff) >> 8) + 0x80)
                           >> 8);
        cStack_121 = (char)(local_9e8 >> 0x38);
        cStack_120 = (char)((ushort)(uVar24 + (uVar24 >> 8) + 0x80) >> 8);
        cStack_11f = (char)(uStack_9e0 >> 8);
        cStack_11e = (char)((ushort)(sStack_3ae * 0xff + ((ushort)(sStack_3ae * 0xff) >> 8) + 0x80)
                           >> 8);
        cStack_11d = (char)(uStack_9e0 >> 0x18);
        cStack_11c = (char)((ushort)(uVar29 + (uVar29 >> 8) + 0x80) >> 8);
        cStack_11b = (char)(uStack_9e0 >> 0x28);
        cStack_11a = (char)((ushort)(sStack_3aa * 0xff + ((ushort)(sStack_3aa * 0xff) >> 8) + 0x80)
                           >> 8);
        cStack_119 = (char)(uStack_9e0 >> 0x38);
        local_a08 = CONCAT17(bVar9 + cStack_121,
                             CONCAT16(cStack_112 + cStack_122,
                                      CONCAT15(cStack_113 + cStack_123,
                                               CONCAT14(cStack_114 + cStack_124,
                                                        CONCAT13(bVar8 + cStack_125,
                                                                 CONCAT12(cStack_116 + cStack_126,
                                                                          CONCAT11(cStack_117 +
                                                                                   cStack_127,
                                                                                   local_118 +
                                                                                   local_128)))))));
        uStack_a00 = CONCAT17(bVar7 + cStack_119,
                              CONCAT16(cStack_10a + cStack_11a,
                                       CONCAT15(cStack_10b + cStack_11b,
                                                CONCAT14(cStack_10c + cStack_11c,
                                                         CONCAT13(bVar6 + cStack_11d,
                                                                  CONCAT12(cStack_10e + cStack_11e,
                                                                           CONCAT11(cStack_10f +
                                                                                    cStack_11f,
                                                                                    cStack_110 +
                                                                                    cStack_120))))))
                             );
        puVar12 = (undefined8 *)(in_RDI + (long)local_96c * 4);
        *puVar12 = local_a08;
        puVar12[1] = uStack_a00;
      }
    }
    for (local_a0c = 0; local_a0c < 3 && local_96c < in_EDX; local_a0c = local_a0c + 1) {
      blend_pixel(in_stack_fffffffffffff5d0,(quint32)((ulong)in_stack_fffffffffffff5c8 >> 0x20),
                  (int)in_stack_fffffffffffff5c8);
      local_96c = local_96c + 1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QT_FASTCALL comp_func_SourceOver_sse2(uint *destPixels, const uint *srcPixels, int length, uint const_alpha)
{
    Q_ASSERT(const_alpha < 256);

    const quint32 *src = (const quint32 *) srcPixels;
    quint32 *dst = (quint32 *) destPixels;

    const __m128i nullVector = _mm_set1_epi32(0);
    const __m128i half = _mm_set1_epi16(0x80);
    const __m128i one = _mm_set1_epi16(0xff);
    const __m128i colorMask = _mm_set1_epi32(0x00ff00ff);
    if (const_alpha == 255) {
        const __m128i alphaMask = _mm_set1_epi32(0xff000000);
        BLEND_SOURCE_OVER_ARGB32_SSE2(dst, src, length, nullVector, half, one, colorMask, alphaMask);
    } else {
        const __m128i constAlphaVector = _mm_set1_epi16(const_alpha);
        BLEND_SOURCE_OVER_ARGB32_WITH_CONST_ALPHA_SSE2(dst, src, length, nullVector, half, one, colorMask, constAlphaVector);
    }
}